

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

int64_t docio_read_doc(docio_handle *handle,uint64_t offset,docio_object *doc,
                      bool read_on_cache_miss)

{
  err_log_callback *log_callback_00;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  docio_length length;
  uint32_t uVar8;
  uint64_t uVar9;
  void *pvVar10;
  byte in_CL;
  ushort *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  byte bVar24;
  docio_length dVar25;
  uint8_t free_body;
  uint8_t free_meta;
  uint32_t crc;
  uint32_t crc_file;
  uint64_t doc_offset;
  err_log_callback *log_callback;
  docio_length zero_length;
  docio_length _length;
  void *comp_body;
  timestamp_t _timestamp;
  fdb_seqnum_t _seqnum;
  int body_alloc;
  int meta_alloc;
  int key_alloc;
  int64_t _offset;
  uint8_t checksum;
  crc_mode_e in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9c;
  uint8_t in_stack_fffffffffffffe9d;
  uint8_t uVar26;
  uint8_t in_stack_fffffffffffffe9e;
  uint8_t uVar27;
  uint8_t in_stack_fffffffffffffe9f;
  uint8_t uVar28;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 uVar31;
  undefined4 uVar32;
  uint8_t *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 read_on_cache_miss_00;
  ulong uVar33;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff10;
  uint32_t in_stack_ffffffffffffff14;
  uint in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  docio_handle *in_stack_ffffffffffffff20;
  docio_handle *handle_00;
  undefined8 local_d0;
  undefined8 local_c8;
  docio_length local_a8;
  docio_length local_98;
  void *local_88;
  uint local_7c;
  ulong local_78;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  fdb_status local_60;
  byte local_52;
  byte local_51;
  ushort *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  fdb_status local_38;
  
  uVar29 = (undefined4)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  read_on_cache_miss_00 = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
  local_51 = in_CL & 1;
  local_64 = 0;
  local_68 = 0;
  local_6c = 0;
  local_88 = (void *)0x0;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  docio_length::docio_length(&local_98);
  docio_length::docio_length(&local_a8);
  log_callback_00 = (err_log_callback *)local_40[6];
  _local_60 = (fdb_status)
              _docio_read_length(in_stack_ffffffffffffff20,
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                 (docio_length *)
                                 CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                 (err_log_callback *)
                                 CONCAT17(in_stack_ffffffffffffff0f,
                                          CONCAT16(in_stack_ffffffffffffff0e,
                                                   in_stack_ffffffffffffff08)),
                                 (bool)read_on_cache_miss_00);
  if ((long)_local_60 < 0) {
    if ((local_51 & 1) != 0) {
      fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_read_doc",0x4dc,0x17f4a5,(int)local_48,*(undefined8 *)*local_40);
    }
    _local_38 = _local_60;
  }
  else {
    memset(&local_a8,0,0x10);
    cVar11 = -((char)local_98.metalen == (char)local_a8.metalen);
    cVar12 = -(local_98.metalen._1_1_ == local_a8.metalen._1_1_);
    cVar13 = -((char)local_98.bodylen == (char)local_a8.bodylen);
    cVar14 = -(local_98.bodylen._1_1_ == local_a8.bodylen._1_1_);
    cVar15 = -(local_98.bodylen._2_1_ == local_a8.bodylen._2_1_);
    cVar16 = -(local_98.bodylen._3_1_ == local_a8.bodylen._3_1_);
    cVar17 = -((char)local_98.bodylen_ondisk == (char)local_a8.bodylen_ondisk);
    cVar18 = -(local_98.bodylen_ondisk._1_1_ == local_a8.bodylen_ondisk._1_1_);
    cVar19 = -(local_98.bodylen_ondisk._2_1_ == local_a8.bodylen_ondisk._2_1_);
    cVar20 = -(local_98.bodylen_ondisk._3_1_ == local_a8.bodylen_ondisk._3_1_);
    cVar21 = -(local_98.flag == local_a8.flag);
    cVar22 = -(local_98.checksum == local_a8.checksum);
    cVar23 = -((char)local_98.reserved == (char)local_a8.reserved);
    bVar24 = -(local_98.reserved._1_1_ == local_a8.reserved._1_1_);
    auVar2[1] = -(local_98.keylen._1_1_ == local_a8.keylen._1_1_);
    auVar2[0] = -((char)local_98.keylen == (char)local_a8.keylen);
    auVar2[2] = cVar11;
    auVar2[3] = cVar12;
    auVar2[4] = cVar13;
    auVar2[5] = cVar14;
    auVar2[6] = cVar15;
    auVar2[7] = cVar16;
    auVar2[8] = cVar17;
    auVar2[9] = cVar18;
    auVar2[10] = cVar19;
    auVar2[0xb] = cVar20;
    auVar2[0xc] = cVar21;
    auVar2[0xd] = cVar22;
    auVar2[0xe] = cVar23;
    auVar2[0xf] = bVar24;
    auVar3[1] = -(local_98.keylen._1_1_ == local_a8.keylen._1_1_);
    auVar3[0] = -((char)local_98.keylen == (char)local_a8.keylen);
    auVar3[2] = cVar11;
    auVar3[3] = cVar12;
    auVar3[4] = cVar13;
    auVar3[5] = cVar14;
    auVar3[6] = cVar15;
    auVar3[7] = cVar16;
    auVar3[8] = cVar17;
    auVar3[9] = cVar18;
    auVar3[10] = cVar19;
    auVar3[0xb] = cVar20;
    auVar3[0xc] = cVar21;
    auVar3[0xd] = cVar22;
    auVar3[0xe] = cVar23;
    auVar3[0xf] = bVar24;
    auVar7[1] = cVar12;
    auVar7[0] = cVar11;
    auVar7[2] = cVar13;
    auVar7[3] = cVar14;
    auVar7[4] = cVar15;
    auVar7[5] = cVar16;
    auVar7[6] = cVar17;
    auVar7[7] = cVar18;
    auVar7[8] = cVar19;
    auVar7[9] = cVar20;
    auVar7[10] = cVar21;
    auVar7[0xb] = cVar22;
    auVar7[0xc] = cVar23;
    auVar7[0xd] = bVar24;
    auVar6[1] = cVar13;
    auVar6[0] = cVar12;
    auVar6[2] = cVar14;
    auVar6[3] = cVar15;
    auVar6[4] = cVar16;
    auVar6[5] = cVar17;
    auVar6[6] = cVar18;
    auVar6[7] = cVar19;
    auVar6[8] = cVar20;
    auVar6[9] = cVar21;
    auVar6[10] = cVar22;
    auVar6[0xb] = cVar23;
    auVar6[0xc] = bVar24;
    auVar5[1] = cVar14;
    auVar5[0] = cVar13;
    auVar5[2] = cVar15;
    auVar5[3] = cVar16;
    auVar5[4] = cVar17;
    auVar5[5] = cVar18;
    auVar5[6] = cVar19;
    auVar5[7] = cVar20;
    auVar5[8] = cVar21;
    auVar5[9] = cVar22;
    auVar5[10] = cVar23;
    auVar5[0xb] = bVar24;
    auVar4[1] = cVar15;
    auVar4[0] = cVar14;
    auVar4[2] = cVar16;
    auVar4[3] = cVar17;
    auVar4[4] = cVar18;
    auVar4[5] = cVar19;
    auVar4[6] = cVar20;
    auVar4[7] = cVar21;
    auVar4[8] = cVar22;
    auVar4[9] = cVar23;
    auVar4[10] = bVar24;
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar24,CONCAT18(cVar23,CONCAT17(cVar22,CONCAT16(cVar21,
                                                  CONCAT15(cVar20,CONCAT14(cVar19,CONCAT13(cVar18,
                                                  CONCAT12(cVar17,CONCAT11(cVar16,cVar15))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar24,CONCAT17(cVar23,CONCAT16(cVar22,CONCAT15(cVar21,
                                                  CONCAT14(cVar20,CONCAT13(cVar19,CONCAT12(cVar18,
                                                  CONCAT11(cVar17,cVar16)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar24 >> 7) << 0xf) == 0xffff) {
      *(ulong *)local_50 =
           CONCAT17(local_a8.bodylen._3_1_,
                    CONCAT16(local_a8.bodylen._2_1_,
                             CONCAT15(local_a8.bodylen._1_1_,
                                      CONCAT14((char)local_a8.bodylen,
                                               CONCAT13(local_a8.metalen._1_1_,
                                                        CONCAT12((char)local_a8.metalen,
                                                                 CONCAT11(local_a8.keylen._1_1_,
                                                                          (char)local_a8.keylen)))))
                            ));
      *(ulong *)(local_50 + 4) =
           CONCAT17(local_a8.reserved._1_1_,
                    CONCAT16((char)local_a8.reserved,
                             CONCAT15(local_a8.checksum,
                                      CONCAT14(local_a8.flag,
                                               CONCAT13(local_a8.bodylen_ondisk._3_1_,
                                                        CONCAT12(local_a8.bodylen_ondisk._2_1_,
                                                                 CONCAT11(local_a8.bodylen_ondisk.
                                                                          _1_1_,(char)local_a8.
                                                  bodylen_ondisk)))))));
      _local_38 = FDB_RESULT_SUCCESS;
    }
    else {
      dVar25.bodylen._0_1_ = in_stack_fffffffffffffe9c;
      dVar25.keylen = (short)in_stack_fffffffffffffe98;
      dVar25.metalen = (short)(in_stack_fffffffffffffe98 >> 0x10);
      dVar25.bodylen._1_1_ = in_stack_fffffffffffffe9d;
      dVar25.bodylen._2_1_ = in_stack_fffffffffffffe9e;
      dVar25.bodylen._3_1_ = in_stack_fffffffffffffe9f;
      dVar25.bodylen_ondisk = in_stack_fffffffffffffea0;
      dVar25.flag = (char)in_stack_fffffffffffffea4;
      dVar25.checksum = (char)((uint)in_stack_fffffffffffffea4 >> 8);
      dVar25.reserved = (short)((uint)in_stack_fffffffffffffea4 >> 0x10);
      local_52 = _docio_length_checksum(dVar25,(docio_handle *)0x122a99);
      if (local_52 == local_98.checksum) {
        uVar9 = CONCAT17(local_98.bodylen._3_1_,
                         CONCAT16(local_98.bodylen._2_1_,
                                  CONCAT15(local_98.bodylen._1_1_,
                                           CONCAT14((char)local_98.bodylen,
                                                    CONCAT13(local_98.metalen._1_1_,
                                                             CONCAT12((char)local_98.metalen,
                                                                      CONCAT11(local_98.keylen._1_1_
                                                                               ,(char)local_98.
                                                  keylen)))))));
        handle_00 = (docio_handle *)
                    CONCAT17(local_98.reserved._1_1_,
                             CONCAT16((char)local_98.reserved,
                                      CONCAT15(local_98.checksum,
                                               CONCAT14(local_98.flag,
                                                        CONCAT13(local_98.bodylen_ondisk._3_1_,
                                                                 CONCAT12(local_98.bodylen_ondisk.
                                                                          _2_1_,CONCAT11(local_98.
                                                  bodylen_ondisk._1_1_,(char)local_98.bodylen_ondisk
                                                  )))))));
        length.bodylen_ondisk = in_stack_fffffffffffffe98;
        length.keylen = 0x2ba4;
        length.metalen = 0x12;
        length.bodylen = 0;
        length.flag = in_stack_fffffffffffffe9c;
        length.checksum = in_stack_fffffffffffffe9d;
        length.reserved._0_1_ = in_stack_fffffffffffffe9e;
        length.reserved._1_1_ = in_stack_fffffffffffffe9f;
        dVar25 = _docio_length_decode(length);
        local_d0 = dVar25._0_8_;
        *(undefined8 *)local_50 = local_d0;
        local_c8 = dVar25._8_8_;
        *(undefined8 *)(local_50 + 4) = local_c8;
        if ((local_50[6] & 0x10) == 0) {
          if ((*local_50 == 0) || (0xfff0 < *local_50)) {
            fdb_log_impl(log_callback_00,2,FDB_RESULT_FILE_CORRUPTION,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_read_doc",0x524,0x17fa4d,(uint)*local_50,*(undefined8 *)*local_40,
                         local_48);
            _local_38 = 0xfffffffffffffff0;
          }
          else {
            if (*(long *)(local_50 + 0xc) == 0) {
              pvVar10 = malloc((ulong)*local_50);
              *(void **)(local_50 + 0xc) = pvVar10;
              local_64 = 1;
            }
            if ((*(long *)(local_50 + 0x14) == 0) && (local_50[1] != 0)) {
              pvVar10 = malloc((ulong)local_50[1]);
              *(void **)(local_50 + 0x14) = pvVar10;
              local_68 = 1;
            }
            if ((*(long *)(local_50 + 0x18) == 0) && (*(int *)(local_50 + 2) != 0)) {
              pvVar10 = malloc((ulong)*(uint *)(local_50 + 2));
              *(void **)(local_50 + 0x18) = pvVar10;
              local_6c = 1;
            }
            _local_60 = (fdb_status)
                        _docio_read_doc_component
                                  (handle_00,uVar9,in_stack_ffffffffffffff1c,
                                   (void *)CONCAT44(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10),
                                   (err_log_callback *)
                                   CONCAT17(in_stack_ffffffffffffff0f,
                                            CONCAT16(in_stack_ffffffffffffff0e,
                                                     in_stack_ffffffffffffff08)));
            if ((long)_local_60 < 0) {
              uVar26 = '\0';
              uVar27 = '\0';
              uVar28 = '\0';
              uVar29 = (undefined4)local_48;
              uVar31 = (undefined4)((ulong)local_48 >> 0x20);
              fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                           ,"docio_read_doc",0x53d,0x17f60b,uVar29,
                           CONCAT44((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(uint)*local_50)
                           ,*(undefined8 *)*local_40);
              free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26);
              _local_38 = _local_60;
            }
            else {
              _local_60 = (fdb_status)
                          _docio_read_doc_component
                                    (handle_00,uVar9,in_stack_ffffffffffffff1c,
                                     (void *)CONCAT44(in_stack_ffffffffffffff14,
                                                      in_stack_ffffffffffffff10),
                                     (err_log_callback *)
                                     CONCAT17(in_stack_ffffffffffffff0f,
                                              CONCAT16(in_stack_ffffffffffffff0e,
                                                       in_stack_ffffffffffffff08)));
              if ((long)_local_60 < 0) {
                uVar26 = '\0';
                uVar27 = '\0';
                uVar28 = '\0';
                uVar29 = (undefined4)local_48;
                uVar31 = (undefined4)((ulong)local_48 >> 0x20);
                fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                             ,"docio_read_doc",0x54b,0x17f75b,uVar29,4,*(undefined8 *)*local_40);
                free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26);
                _local_38 = _local_60;
              }
              else {
                *(uint *)(local_50 + 8) =
                     local_7c >> 0x18 | (local_7c & 0xff0000) >> 8 | (local_7c & 0xff00) << 8 |
                     local_7c << 0x18;
                _local_60 = (fdb_status)
                            _docio_read_doc_component
                                      (handle_00,uVar9,in_stack_ffffffffffffff1c,
                                       (void *)CONCAT44(in_stack_ffffffffffffff14,
                                                        in_stack_ffffffffffffff10),
                                       (err_log_callback *)
                                       CONCAT17(in_stack_ffffffffffffff0f,
                                                CONCAT16(in_stack_ffffffffffffff0e,
                                                         in_stack_ffffffffffffff08)));
                if ((long)_local_60 < 0) {
                  uVar26 = '\0';
                  uVar27 = '\0';
                  uVar28 = '\0';
                  uVar29 = (undefined4)local_48;
                  uVar31 = (undefined4)((ulong)local_48 >> 0x20);
                  fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                               ,"docio_read_doc",0x55a,0x17f7ad,uVar29,8,*(undefined8 *)*local_40);
                  free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26);
                  _local_38 = _local_60;
                }
                else {
                  *(ulong *)(local_50 + 0x10) =
                       local_78 >> 0x38 | (local_78 & 0xff000000000000) >> 0x28 |
                       (local_78 & 0xff0000000000) >> 0x18 | (local_78 & 0xff00000000) >> 8 |
                       (local_78 & 0xff000000) << 8 | (local_78 & 0xff0000) << 0x18 |
                       (local_78 & 0xff00) << 0x28 | local_78 << 0x38;
                  _local_60 = (fdb_status)
                              _docio_read_doc_component
                                        (handle_00,uVar9,in_stack_ffffffffffffff1c,
                                         (void *)CONCAT44(in_stack_ffffffffffffff14,
                                                          in_stack_ffffffffffffff10),
                                         (err_log_callback *)
                                         CONCAT17(in_stack_ffffffffffffff0f,
                                                  CONCAT16(in_stack_ffffffffffffff0e,
                                                           in_stack_ffffffffffffff08)));
                  if ((long)_local_60 < 0) {
                    uVar26 = '\0';
                    uVar27 = '\0';
                    uVar28 = '\0';
                    uVar29 = (undefined4)local_48;
                    uVar31 = (undefined4)((ulong)local_48 >> 0x20);
                    fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                                 ,"docio_read_doc",0x566,0x17f805,uVar29,
                                 CONCAT44((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                          (uint)local_50[1]),*(undefined8 *)*local_40);
                    free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26);
                    _local_38 = _local_60;
                  }
                  else {
                    _local_60 = (fdb_status)
                                _docio_read_doc_component
                                          (handle_00,uVar9,in_stack_ffffffffffffff1c,
                                           (void *)CONCAT44(in_stack_ffffffffffffff14,
                                                            in_stack_ffffffffffffff10),
                                           (err_log_callback *)
                                           CONCAT17(in_stack_ffffffffffffff0f,
                                                    CONCAT16(in_stack_ffffffffffffff0e,
                                                             in_stack_ffffffffffffff08)));
                    if ((long)_local_60 < 0) {
                      uVar26 = '\0';
                      uVar27 = '\0';
                      uVar28 = '\0';
                      uVar29 = (undefined4)local_48;
                      uVar31 = (undefined4)((ulong)local_48 >> 0x20);
                      fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                                   ,"docio_read_doc",0x58f,0x17faad,uVar29,
                                   CONCAT44((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                                            *(undefined4 *)(local_50 + 2)),*(undefined8 *)*local_40)
                      ;
                      free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26
                                       );
                      _local_38 = _local_60;
                    }
                    else {
                      _local_60 = (fdb_status)
                                  _docio_read_doc_component
                                            (handle_00,uVar9,in_stack_ffffffffffffff1c,
                                             (void *)CONCAT44(in_stack_ffffffffffffff14,
                                                              in_stack_ffffffffffffff10),
                                             (err_log_callback *)
                                             CONCAT17(in_stack_ffffffffffffff0f,
                                                      CONCAT16(in_stack_ffffffffffffff0e,
                                                               in_stack_ffffffffffffff08)));
                      if ((long)_local_60 < 0) {
                        uVar26 = '\0';
                        uVar27 = '\0';
                        uVar28 = '\0';
                        uVar29 = (undefined4)local_48;
                        uVar31 = (undefined4)((ulong)local_48 >> 0x20);
                        fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                                     ,"docio_read_doc",0x59d,0x17faf9,uVar29,4,
                                     *(undefined8 *)*local_40);
                        if (local_88 != (void *)0x0) {
                          free(local_88);
                        }
                        free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,
                                          uVar26);
                        _local_38 = _local_60;
                      }
                      else {
                        get_checksum((uint8_t *)
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     CONCAT17(in_stack_fffffffffffffe9f,
                                              CONCAT16(in_stack_fffffffffffffe9e,
                                                       CONCAT15(in_stack_fffffffffffffe9d,
                                                                CONCAT14(in_stack_fffffffffffffe9c,
                                                                         in_stack_fffffffffffffe98))
                                                      )),CRC_UNKNOWN);
                        get_checksum(in_stack_fffffffffffffea8,
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     CONCAT13(in_stack_fffffffffffffe9f,
                                              CONCAT12(in_stack_fffffffffffffe9e,
                                                       CONCAT11(in_stack_fffffffffffffe9d,
                                                                in_stack_fffffffffffffe9c))),
                                     in_stack_fffffffffffffe98);
                        get_checksum(in_stack_fffffffffffffea8,
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     CONCAT13(in_stack_fffffffffffffe9f,
                                              CONCAT12(in_stack_fffffffffffffe9e,
                                                       CONCAT11(in_stack_fffffffffffffe9d,
                                                                in_stack_fffffffffffffe9c))),
                                     in_stack_fffffffffffffe98);
                        get_checksum(in_stack_fffffffffffffea8,
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     CONCAT13(in_stack_fffffffffffffe9f,
                                              CONCAT12(in_stack_fffffffffffffe9e,
                                                       CONCAT11(in_stack_fffffffffffffe9d,
                                                                in_stack_fffffffffffffe9c))),
                                     in_stack_fffffffffffffe98);
                        get_checksum(in_stack_fffffffffffffea8,
                                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                                     CONCAT13(in_stack_fffffffffffffe9f,
                                              CONCAT12(in_stack_fffffffffffffe9e,
                                                       CONCAT11(in_stack_fffffffffffffe9d,
                                                                in_stack_fffffffffffffe9c))),
                                     in_stack_fffffffffffffe98);
                        if ((local_50[6] & 2) == 0) {
                          uVar8 = get_checksum(in_stack_fffffffffffffea8,
                                               CONCAT44(in_stack_fffffffffffffea4,
                                                        in_stack_fffffffffffffea0),
                                               CONCAT13(in_stack_fffffffffffffe9f,
                                                        CONCAT12(in_stack_fffffffffffffe9e,
                                                                 CONCAT11(in_stack_fffffffffffffe9d,
                                                                          in_stack_fffffffffffffe9c)
                                                                )),in_stack_fffffffffffffe98);
                          uVar31 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
                        }
                        else {
                          uVar8 = get_checksum(in_stack_fffffffffffffea8,
                                               CONCAT44(in_stack_fffffffffffffea4,
                                                        in_stack_fffffffffffffea0),
                                               CONCAT13(in_stack_fffffffffffffe9f,
                                                        CONCAT12(in_stack_fffffffffffffe9e,
                                                                 CONCAT11(in_stack_fffffffffffffe9d,
                                                                          in_stack_fffffffffffffe9c)
                                                                )),in_stack_fffffffffffffe98);
                          uVar31 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
                          if (local_88 != (void *)0x0) {
                            free(local_88);
                          }
                        }
                        if (uVar8 == in_stack_ffffffffffffff14) {
                          free_docio_object((docio_object *)
                                            CONCAT44(in_stack_fffffffffffffea4,
                                                     in_stack_fffffffffffffea0),
                                            in_stack_fffffffffffffe9f,in_stack_fffffffffffffe9e,
                                            in_stack_fffffffffffffe9d);
                          _local_38 = _local_60;
                        }
                        else {
                          uVar26 = '\0';
                          uVar27 = '\0';
                          uVar28 = '\0';
                          uVar30 = (undefined4)*(undefined8 *)*local_40;
                          uVar32 = (undefined4)((ulong)*(undefined8 *)*local_40 >> 0x20);
                          fdb_log_impl(log_callback_00,2,FDB_RESULT_CHECKSUM_ERROR,
                                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                                       ,"docio_read_doc",0x5cd,0x17fb51,uVar30,
                                       CONCAT44(uVar31,uVar8),
                                       CONCAT44(uVar29,in_stack_ffffffffffffff14),
                                       (uint)CONCAT11(local_98.keylen._1_1_,(char)local_98.keylen),
                                       (uint)CONCAT11(local_98.metalen._1_1_,(char)local_98.metalen)
                                       ,CONCAT13(local_98.bodylen._3_1_,
                                                 CONCAT12(local_98.bodylen._2_1_,
                                                          CONCAT11(local_98.bodylen._1_1_,
                                                                   (char)local_98.bodylen))),
                                       CONCAT13(local_98.bodylen_ondisk._3_1_,
                                                CONCAT12(local_98.bodylen_ondisk._2_1_,
                                                         CONCAT11(local_98.bodylen_ondisk._1_1_,
                                                                  (char)local_98.bodylen_ondisk))),
                                       local_48);
                          free_docio_object((docio_object *)CONCAT44(uVar32,uVar30),uVar28,uVar27,
                                            uVar26);
                          _local_38 = 0xfffffffffffffff1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else if ((((*local_50 == 0) && (local_50[1] == 0)) && (*(int *)(local_50 + 2) == 0)) &&
                (*(int *)(local_50 + 4) == 0)) {
          _local_60 = (fdb_status)
                      _docio_read_doc_component
                                (handle_00,uVar9,in_stack_ffffffffffffff1c,
                                 (void *)CONCAT44(in_stack_ffffffffffffff14,
                                                  in_stack_ffffffffffffff10),
                                 (err_log_callback *)
                                 CONCAT17(in_stack_ffffffffffffff0f,
                                          CONCAT16(in_stack_ffffffffffffff0e,
                                                   in_stack_ffffffffffffff08)));
          if ((long)_local_60 < 0) {
            uVar26 = '\0';
            uVar27 = '\0';
            uVar28 = '\0';
            uVar29 = (undefined4)local_48;
            uVar31 = (undefined4)((ulong)local_48 >> 0x20);
            fdb_log_impl(log_callback_00,2,(fdb_status)((ulong)_local_60 & 0xffffffff),
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                         ,"docio_read_doc",0x50d,0x17f974,uVar29,*(undefined8 *)*local_40);
            free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26);
            _local_38 = _local_60;
          }
          else {
            *(ulong *)(local_50 + 0x10) =
                 (ulong)(in_stack_ffffffffffffff1c >> 0x18) |
                 (((ulong)in_stack_ffffffffffffff1c & 0xff0000) << 0x20) >> 0x28 |
                 (((ulong)in_stack_ffffffffffffff1c & 0xff00) << 0x20) >> 0x18 |
                 (((ulong)in_stack_ffffffffffffff1c & 0xff) << 0x20) >> 8 |
                 ((ulong)in_stack_ffffffffffffff18 & 0xff000000) << 8 |
                 ((ulong)in_stack_ffffffffffffff18 & 0xff0000) << 0x18 |
                 ((ulong)in_stack_ffffffffffffff18 & 0xff00) << 0x28 |
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18) << 0x38;
            uVar33 = *(ulong *)(local_50 + 0x10);
            uVar9 = filemgr_get_pos((filemgr *)0x122e88);
            if (uVar9 < uVar33) {
              uVar1 = *(undefined8 *)(local_50 + 0x10);
              uVar9 = filemgr_get_pos((filemgr *)0x122ec7);
              uVar26 = '\0';
              uVar27 = '\0';
              uVar28 = '\0';
              uVar29 = (undefined4)uVar1;
              uVar31 = (undefined4)((ulong)uVar1 >> 0x20);
              fdb_log_impl(log_callback_00,2,FDB_RESULT_FILE_CORRUPTION,
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                           ,"docio_read_doc",0x519,0x17f9cd,uVar29,uVar9,*(undefined8 *)*local_40);
              free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26);
              _local_38 = 0xfffffffffffffff0;
            }
            else {
              _local_38 = _local_60;
            }
          }
        }
        else {
          uVar26 = '\0';
          uVar27 = '\0';
          uVar28 = '\0';
          uVar29 = (undefined4)*(undefined8 *)*local_40;
          uVar31 = (undefined4)((ulong)*(undefined8 *)*local_40 >> 0x20);
          fdb_log_impl(log_callback_00,2,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                       ,"docio_read_doc",0x501,0x17f902,uVar29,local_48);
          free_docio_object((docio_object *)CONCAT44(uVar31,uVar29),uVar28,uVar27,uVar26);
          _local_38 = 0xfffffffffffffff0;
        }
      }
      else {
        fdb_log_impl(log_callback_00,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc",0x4f1,0x17f86b,(int)*(undefined8 *)*local_40,
                     CONCAT44((int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(uint)local_52),
                     CONCAT44(uVar29,(uint)local_98.checksum),
                     (uint)CONCAT11(local_98.keylen._1_1_,(char)local_98.keylen),
                     (uint)CONCAT11(local_98.metalen._1_1_,(char)local_98.metalen),
                     CONCAT13(local_98.bodylen._3_1_,
                              CONCAT12(local_98.bodylen._2_1_,
                                       CONCAT11(local_98.bodylen._1_1_,(char)local_98.bodylen))),
                     CONCAT13(local_98.bodylen_ondisk._3_1_,
                              CONCAT12(local_98.bodylen_ondisk._2_1_,
                                       CONCAT11(local_98.bodylen_ondisk._1_1_,
                                                (char)local_98.bodylen_ondisk))),local_48);
        _local_38 = 0xfffffffffffffff1;
      }
    }
  }
  return (int64_t)_local_38;
}

Assistant:

int64_t docio_read_doc(struct docio_handle *handle, uint64_t offset,
                       struct docio_object *doc,
                       bool read_on_cache_miss)
{
    uint8_t checksum;
    int64_t _offset;
    int key_alloc = 0;
    int meta_alloc = 0;
    int body_alloc = 0;
    fdb_seqnum_t _seqnum;
    timestamp_t _timestamp;
    void *comp_body = NULL;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback,
                                 read_on_cache_miss);
    if (_offset < 0) {
        if (read_on_cache_miss) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading the doc length metadata with offset %" _F64 " from "
                    "a database file '%s'",
                    offset, handle->file->filename);
        }
        return _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        doc->length = zero_length;
        return (int64_t) FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length body checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }

    doc->length = _docio_length_decode(_length);
    if (doc->length.flag & DOCIO_TXN_COMMITTED) {
        // transaction commit mark
        // read the corresponding doc offset

        // If TXN_COMMITTED flag is set, this doc is not an actual doc, but a
        // transaction commit marker. Thus, all lengths should be zero.
        if (doc->length.keylen || doc->length.metalen ||
            doc->length.bodylen || doc->length.bodylen_ondisk) {
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                    "File corruption: Doc length fields in a transaction commit marker "
                    "was not zero in a database file '%s' offset %" _F64,
                    handle->file->filename, offset);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return (int64_t) FDB_RESULT_FILE_CORRUPTION;
        }

        uint64_t doc_offset;
        _offset = _docio_read_doc_component(handle, _offset,
                                            sizeof(doc_offset), &doc_offset,
                                            log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading an offset of a committed doc from an offset %" _F64
                    " in a database file '%s'", offset, handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
        doc->doc_offset = _endian_decode(doc_offset);
        // The offset of the actual document that pointed by this commit marker
        // should not be greater than the file size.
        if (doc->doc_offset > filemgr_get_pos(handle->file)) {
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                    "File corruption: Offset %" _F64 " of the actual doc pointed by the "
                    "commit marker is greater than the size %" _F64 " of a database file '%s'",
                    doc->doc_offset, filemgr_get_pos(handle->file),
                    handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return (int64_t) FDB_RESULT_FILE_CORRUPTION;
        }
        return _offset;
    }

    if (doc->length.keylen == 0 || doc->length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata (key length: %d) from "
                "a database file '%s' offset %" _F64, doc->length.keylen,
                handle->file->filename, offset);
        return (int64_t) FDB_RESULT_FILE_CORRUPTION;
    }

    if (doc->key == NULL) {
        doc->key = (void *)malloc(doc->length.keylen);
        key_alloc = 1;
    }
    if (doc->meta == NULL && doc->length.metalen) {
        doc->meta = (void *)malloc(doc->length.metalen);
        meta_alloc = 1;
    }
    if (doc->body == NULL && doc->length.bodylen) {
        doc->body = (void *)malloc(doc->length.bodylen);
        body_alloc = 1;
    }

    _offset = _docio_read_doc_component(handle, _offset,
                                        doc->length.keylen,
                                        doc->key,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.keylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

    // read timestamp
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(timestamp_t),
                                        &_timestamp,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a timestamp with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(timestamp_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
    doc->timestamp = _endian_decode(_timestamp);

    // copy seqeunce number (optional)
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(fdb_seqnum_t),
                                        (void *)&_seqnum,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a sequence number with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(fdb_seqnum_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
    doc->seqnum = _endian_decode(_seqnum);

    _offset = _docio_read_doc_component(handle, _offset, doc->length.metalen,
                                        doc->meta, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc metadata with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.metalen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

#ifdef _DOC_COMP
    if (doc->length.flag & DOCIO_COMPRESSED) {
        comp_body = (void*)malloc(doc->length.bodylen_ondisk);
        _offset = _docio_read_doc_component_comp(handle, _offset, doc->length.bodylen,
                                                 doc->length.bodylen_ondisk, doc->body,
                                                 comp_body, log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading a compressed doc with offset %" _F64 ", length %d "
                    "from a database file '%s'", offset, doc->length.bodylen,
                    handle->file->filename);
            if (comp_body) {
                free(comp_body);
            }
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
    } else {
        _offset = _docio_read_doc_component(handle, _offset, doc->length.bodylen,
                                            doc->body, log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading a doc with offset %" _F64 ", length %d "
                    "from a database file '%s'", offset, doc->length.bodylen,
                    handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
    }
#else
    _offset = _docio_read_doc_component(handle, _offset, doc->length.bodylen,
                                        doc->body, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a doc with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.bodylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
#endif

#ifdef __CRC32
    uint32_t crc_file, crc;
    _offset = _docio_read_doc_component(handle, _offset, sizeof(crc_file),
                                        (void *)&crc_file, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a doc's CRC value with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(crc_file),
                handle->file->filename);
        if (comp_body) {
            free(comp_body);
        }
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_length),
                       sizeof(_length),
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->key),
                       doc->length.keylen,
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_timestamp),
                       sizeof(timestamp_t),
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_seqnum),
                       sizeof(fdb_seqnum_t),
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->meta),
                       doc->length.metalen,
                       crc,
                       handle->file->crc_mode);

    if (doc->length.flag & DOCIO_COMPRESSED) {
        crc = get_checksum(reinterpret_cast<const uint8_t*>(comp_body),
                           doc->length.bodylen_ondisk,
                           crc,
                           handle->file->crc_mode);
        if (comp_body) {
            free(comp_body);
        }
    } else {
        crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->body),
                           doc->length.bodylen,
                           crc,
                           handle->file->crc_mode);
    }
    if (crc != crc_file) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_body checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                crc, crc_file, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }
#endif

    uint8_t free_meta = meta_alloc && !doc->length.metalen;
    uint8_t free_body = body_alloc && !doc->length.bodylen;
    free_docio_object(doc, 0, free_meta, free_body);

    return _offset;
}